

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::check_spot_timeseries_args_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Options *opts)

{
  bool bVar1;
  char *pcVar2;
  Options *opts_00;
  allocator<char> local_ca;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  char *local_a8;
  char *opt;
  char **__end2;
  char **__begin2;
  char *(*__range2) [5];
  char *tsopts [5];
  string local_58;
  undefined1 local_28 [8];
  ConfigManager tmpmgr;
  Options *opts_local;
  
  tmpmgr.mP.super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  bVar1 = cali::ConfigManager::Options::is_enabled((Options *)this,"timeseries");
  if (bVar1) {
    cali::ConfigManager::ConfigManager((ConfigManager *)local_28);
    cali::ConfigManager::add_config_spec
              ((ConfigManager *)local_28,(ConfigInfo *)spot_timeseries_info);
    get_timeseries_config_string_abi_cxx11_
              (&local_58,
               (_anonymous_namespace_ *)
               tmpmgr.mP.
               super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi,opts_00);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cali::ConfigManager::check_abi_cxx11_
              (__return_storage_ptr__,(ConfigManager *)local_28,pcVar2,false);
    std::__cxx11::string::~string((string *)&local_58);
    cali::ConfigManager::~ConfigManager((ConfigManager *)local_28);
  }
  else {
    memcpy(&__range2,&PTR_anon_var_dwarf_3fcec2_00550340,0x28);
    opt = (char *)(tsopts + 4);
    __end2 = (char **)&__range2;
    __begin2 = __end2;
    for (; __end2 != (char **)opt; __end2 = __end2 + 1) {
      local_a8 = *__end2;
      bVar1 = cali::ConfigManager::Options::is_set
                        ((Options *)
                         tmpmgr.mP.
                         super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi,local_a8);
      pcVar2 = local_a8;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar2,&local_c9);
        std::operator+(__return_storage_ptr__,&local_c8,
                       " is set but the timeseries option is not enabled");
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator(&local_c9);
        return __return_storage_ptr__;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_ca);
    std::allocator<char>::~allocator(&local_ca);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string check_spot_timeseries_args(const cali::ConfigManager::Options& opts)
{
    if (opts.is_enabled("timeseries")) {
        // Check if the timeseries options are valid

        cali::ConfigManager tmpmgr;

        tmpmgr.add_config_spec(spot_timeseries_info);
        return tmpmgr.check(get_timeseries_config_string(opts).c_str());
    } else {
        // Warn when a timeseries option is set but timeseries is disabled

        const char* tsopts[] = { "timeseries.maxrows",
                                 "timeseries.iteration_interval",
                                 "timeseries.time_interval",
                                 "timeseries.target_loops",
                                 "timeseries.metrics" };

        for (const char* opt : tsopts)
            if (opts.is_set(opt))
                return std::string(opt) + " is set but the timeseries option is not enabled";
    }

    return "";
}